

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_multi_var
              (secp256k1_ecmult_context *ctx,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  int iVar1;
  long in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong in_stack_00000008;
  secp256k1_gej tmp;
  size_t offset;
  size_t nbp;
  secp256k1_scalar szero;
  size_t n_batch_points;
  size_t n_batches;
  size_t max_points;
  _func_int_secp256k1_ecmult_context_ptr_secp256k1_scratch_ptr_secp256k1_gej_ptr_secp256k1_scalar_ptr_secp256k1_ecmult_multi_callback_ptr_void_ptr_size_t_size_t
  *f;
  size_t i;
  secp256k1_scalar *in_stack_00000af0;
  secp256k1_scalar *in_stack_00000af8;
  secp256k1_gej *in_stack_00000b00;
  secp256k1_gej *in_stack_00000b08;
  secp256k1_ecmult_context *in_stack_00000b10;
  secp256k1_scratch *in_stack_fffffffffffffec0;
  long local_138;
  ulong local_118;
  undefined1 local_110 [16];
  secp256k1_scratch *in_stack_ffffffffffffff00;
  secp256k1_scalar local_80;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  code *local_48;
  ulong local_40;
  undefined8 local_38;
  undefined8 local_30;
  long local_28;
  long local_18;
  undefined8 local_10;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  secp256k1_gej_set_infinity((secp256k1_gej *)0x117d2c);
  if ((local_28 == 0) && (in_stack_00000008 == 0)) {
    local_4 = 1;
  }
  else if (in_stack_00000008 == 0) {
    secp256k1_scalar_set_int(&local_80,0);
    secp256k1_ecmult(in_stack_00000b10,in_stack_00000b08,in_stack_00000b00,in_stack_00000af8,
                     in_stack_00000af0);
    local_4 = 1;
  }
  else if (local_18 == 0) {
    local_4 = secp256k1_ecmult_multi_var_simple
                        ((secp256k1_ecmult_context *)tmp.y.n[3],(secp256k1_gej *)tmp.y.n[2],
                         (secp256k1_scalar *)tmp.y.n[1],
                         (secp256k1_ecmult_multi_callback *)tmp.y.n[0],(void *)tmp.x.n[4],tmp.x.n[3]
                        );
  }
  else {
    local_50 = secp256k1_pippenger_max_points(in_stack_ffffffffffffff00);
    if (local_50 == 0) {
      local_4 = 0;
    }
    else {
      if (10000000 < local_50) {
        local_50 = 10000000;
      }
      local_58 = ((in_stack_00000008 + local_50) - 1) / local_50;
      local_60 = ((in_stack_00000008 + local_58) - 1) / local_58;
      if (local_60 < 0xa0) {
        local_50 = secp256k1_strauss_max_points(in_stack_fffffffffffffec0);
        if (local_50 == 0) {
          return 0;
        }
        local_58 = ((in_stack_00000008 + local_50) - 1) / local_50;
        local_60 = ((in_stack_00000008 + local_58) - 1) / local_58;
        local_48 = secp256k1_ecmult_strauss_batch;
      }
      else {
        local_48 = secp256k1_ecmult_pippenger_batch;
      }
      for (local_40 = 0; local_40 < local_58; local_40 = local_40 + 1) {
        if (in_stack_00000008 < local_60) {
          local_118 = in_stack_00000008;
        }
        else {
          local_118 = local_60;
        }
        if (local_40 == 0) {
          local_138 = local_28;
        }
        else {
          local_138 = 0;
        }
        iVar1 = (*local_48)(local_10,local_18,local_110,local_138,local_30,local_38,local_118,
                            local_60 * local_40);
        if (iVar1 == 0) {
          return 0;
        }
        secp256k1_gej_add_var
                  ((secp256k1_gej *)tmp._120_8_,(secp256k1_gej *)tmp.z.n[4],
                   (secp256k1_gej *)tmp.z.n[3],(secp256k1_fe *)tmp.z.n[2]);
        in_stack_00000008 = in_stack_00000008 - local_118;
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_ecmult_context *ctx, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_ecmult_context*, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t max_points;
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_scalar szero;
        secp256k1_scalar_set_int(&szero, 0);
        secp256k1_ecmult(ctx, r, r, &szero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_var_simple(ctx, r, inp_g_sc, cb, cbdata, n);
    }

    max_points = secp256k1_pippenger_max_points(scratch);
    if (max_points == 0) {
        return 0;
    } else if (max_points > ECMULT_MAX_POINTS_PER_BATCH) {
        max_points = ECMULT_MAX_POINTS_PER_BATCH;
    }
    n_batches = (n+max_points-1)/max_points;
    n_batch_points = (n+n_batches-1)/n_batches;

    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        max_points = secp256k1_strauss_max_points(scratch);
        if (max_points == 0) {
            return 0;
        }
        n_batches = (n+max_points-1)/max_points;
        n_batch_points = (n+n_batches-1)/n_batches;
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(ctx, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}